

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O0

void __thiscall SAT::varDecayActivity(SAT *this)

{
  int iVar1;
  uint uVar2;
  double *pdVar3;
  IntVar **ppIVar4;
  long in_RDI;
  uint i_1;
  int i;
  uint local_10;
  uint local_c;
  
  *(double *)(in_RDI + 0x198) = *(double *)(in_RDI + 0x198) * 1.05;
  if (1e+100 < *(double *)(in_RDI + 0x198)) {
    local_c = 0;
    while( true ) {
      iVar1 = nVars((SAT *)0x29aadf);
      if (iVar1 <= (int)local_c) break;
      pdVar3 = vec<double>::operator[]((vec<double> *)(in_RDI + 0x1a8),local_c);
      *pdVar3 = *pdVar3 * 1e-100;
      local_c = local_c + 1;
    }
    local_10 = 0;
    while( true ) {
      uVar2 = vec<IntVar_*>::size(&engine.vars);
      if (uVar2 <= local_10) break;
      ppIVar4 = vec<IntVar_*>::operator[](&engine.vars,local_10);
      (*ppIVar4)->activity = (*ppIVar4)->activity * 1e-100;
      local_10 = local_10 + 1;
    }
    *(double *)(in_RDI + 0x198) = *(double *)(in_RDI + 0x198) * 1e-100;
  }
  return;
}

Assistant:

inline void SAT::varDecayActivity() {
	var_inc *= 1.05;
	if (var_inc > 1e100) {
		for (int i = 0; i < nVars(); i++) {
			activity[i] *= 1e-100;
		}
		for (unsigned int i = 0; i < engine.vars.size(); i++) {
			engine.vars[i]->activity *= 1e-100;
		}
		var_inc *= 1e-100;
	}
}